

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O2

Point3f __thiscall pbrt::Interaction::OffsetRayOrigin(Interaction *this,Vector3f *w)

{
  Tuple3<pbrt::Point3,_float> TVar1;
  
  TVar1 = (Tuple3<pbrt::Point3,_float>)
          pbrt::OffsetRayOrigin
                    ((Point3fi)
                     (this->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>,
                     (Normal3f)(this->n).super_Tuple3<pbrt::Normal3,_float>,
                     (Vector3f)w->super_Tuple3<pbrt::Vector3,_float>);
  return (Point3f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Point3f OffsetRayOrigin(const Vector3f &w) const {
        return pbrt::OffsetRayOrigin(pi, n, w);
    }